

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_compile_commands.cxx
# Opt level: O0

void __thiscall CompileCommandParser::ParseTranslationUnits(CompileCommandParser *this)

{
  bool bVar1;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  local_28;
  CompileCommandParser *local_10;
  CompileCommandParser *this_local;
  
  local_28.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.
  super__Vector_base<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_10 = this;
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::vector(&local_28);
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::operator=(&this->TranslationUnits,&local_28);
  std::vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>
  ::~vector(&local_28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_48,"at start of compile command file\n",&local_49);
  ExpectOrDie(this,'[',&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  do {
    ParseTranslationUnit(this);
    std::
    vector<CompileCommandParser::CommandType,_std::allocator<CompileCommandParser::CommandType>_>::
    push_back(&this->TranslationUnits,&this->Command);
    bVar1 = Expect(this,',');
  } while (bVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_80,"at end of array",&local_81);
  ExpectOrDie(this,']',&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  return;
}

Assistant:

void ParseTranslationUnits()
  {
    this->TranslationUnits = TranslationUnitsType();
    ExpectOrDie('[', "at start of compile command file\n");
    do
      {
      ParseTranslationUnit();
      this->TranslationUnits.push_back(this->Command);
      } while(Expect(','));
    ExpectOrDie(']', "at end of array");
  }